

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Mat *pMVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  void *pvVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  undefined4 *puVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  int local_238;
  undefined4 *local_210;
  Mat local_208;
  long local_1d0;
  long local_1c8;
  size_t local_1c0;
  Option *local_1b8;
  ulong local_1b0;
  long local_1a8;
  ulong local_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  Mat *local_170;
  long local_168;
  ulong local_160;
  ulong local_158;
  long local_150;
  ulong local_148;
  Mat bottom_blob_bordered;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  Option opt_g;
  
  uVar1 = bottom_blob->w;
  iVar18 = bottom_blob->h;
  local_1c0 = bottom_blob->elemsize;
  iVar2 = (this->super_Convolution).kernel_w;
  iVar3 = (this->super_Convolution).stride_w;
  iVar20 = (this->super_Convolution).dilation_w;
  local_188 = (ulong)iVar20;
  iVar20 = (iVar2 + -1) * iVar20;
  local_170 = top_blob;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  iVar13 = (this->super_Convolution).pad_w;
  iVar27 = (this->super_Convolution).pad_h;
  local_238 = -100;
  if (iVar27 < 1 && iVar13 < 1) {
    if (iVar27 == -0xe9 && iVar13 == -0xe9) {
      iVar27 = iVar20 - (int)(uVar1 - 1) % iVar3;
      iVar13 = iVar20 - (iVar18 + -1) % iVar3;
      if ((0 < iVar27) ||
         (iVar18 = bottom_blob_bordered.h, uVar1 = bottom_blob_bordered.w, 0 < iVar13)) {
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar13 / 2,iVar13 - iVar13 / 2,iVar27 / 2
                         ,iVar27 - iVar27 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        if (bottom_blob_bordered.data == (void *)0x0) goto LAB_0010a6fc;
        lVar11 = (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep;
        uVar1 = bottom_blob_bordered.w;
        iVar18 = bottom_blob_bordered.h;
        goto joined_r0x00109fe9;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&bottom_blob_bordered,iVar27,iVar27,iVar13,iVar13,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    if (bottom_blob_bordered.data == (void *)0x0) goto LAB_0010a6fc;
    lVar11 = (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep;
    uVar1 = bottom_blob_bordered.w;
    iVar18 = bottom_blob_bordered.h;
joined_r0x00109fe9:
    bottom_blob_bordered.w = uVar1;
    bottom_blob_bordered.h = iVar18;
    if (lVar11 == 0) goto LAB_0010a6fc;
  }
  pMVar6 = local_170;
  local_1b0 = (ulong)uVar1;
  iVar13 = (int)(uVar1 - (iVar20 + 1)) / iVar3;
  iVar27 = iVar13 + 1;
  Mat::create(local_170,iVar27,(iVar18 - (iVar20 + 1)) / iVar3 + 1,
              (this->super_Convolution).num_output,local_1c0,opt->blob_allocator);
  uVar5 = local_188;
  if ((pMVar6->data != (void *)0x0) && ((long)pMVar6->c * pMVar6->cstep != 0)) {
    iVar14 = (int)local_188;
    uVar15 = local_188 & 0xffffffff;
    inner_bottom_blob.dims = 0;
    inner_bottom_blob.w = 0;
    inner_bottom_blob.h = 0;
    inner_bottom_blob.c = 0;
    inner_bottom_blob.elemsize = 0;
    inner_bottom_blob.allocator = (Allocator *)0x0;
    inner_bottom_blob.cstep = 0;
    inner_bottom_blob.data = (void *)0x0;
    inner_bottom_blob.refcount = (int *)0x0;
    inner_top_blob.dims = 0;
    inner_top_blob.w = 0;
    inner_top_blob.h = 0;
    inner_top_blob.c = 0;
    inner_top_blob.elemsize = 0;
    inner_top_blob.allocator = (Allocator *)0x0;
    inner_top_blob.data = (void *)0x0;
    inner_top_blob.refcount = (int *)0x0;
    inner_top_blob.cstep = 0;
    iVar20 = (int)local_1b0;
    local_194 = iVar14 + iVar20 + -1;
    local_198 = iVar14 + -1 + iVar18;
    uVar19 = 0;
    if (0 < iVar14) {
      uVar19 = local_188 & 0xffffffff;
    }
    local_1b0 = (ulong)(uint)(iVar20 * iVar14);
    local_1c8 = 0;
    local_1d0 = 0;
    local_1b8 = opt;
    local_160 = uVar15;
    local_158 = uVar19;
    for (uVar17 = 0; local_238 = 0, uVar17 != uVar19; uVar17 = uVar17 + 1) {
      local_190 = local_198 - (int)uVar17;
      local_168 = local_1c8;
      local_150 = local_1d0;
      for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
        uVar19 = (long)(local_194 - (int)uVar12) / (long)(int)local_188;
        uVar4 = (long)local_190 / (long)(int)uVar15;
        uVar23 = uVar4 & 0xffffffff;
        iVar18 = (int)uVar19;
        local_178 = (long)(iVar18 - iVar2) / (long)iVar3 & 0xffffffff;
        iVar10 = (int)uVar4;
        local_180 = (long)(iVar10 - iVar2) / (long)iVar3 & 0xffffffff;
        Mat::create(&inner_bottom_blob,iVar18,iVar10,bottom_blob->c,local_1c0,
                    local_1b8->workspace_allocator);
        if ((inner_bottom_blob.data == (void *)0x0) ||
           ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)) {
LAB_0010a6db:
          local_238 = -100;
          goto LAB_0010a6e2;
        }
        local_18c = (int)local_178 + 1;
        Mat::create(&inner_top_blob,local_18c,(int)local_180 + 1,
                    (this->super_Convolution).num_output,local_1c0,local_1b8->workspace_allocator);
        if ((inner_top_blob.data == (void *)0x0) ||
           ((long)inner_top_blob.c * inner_top_blob.cstep == 0)) goto LAB_0010a6db;
        uVar19 = uVar19 & 0xffffffff;
        if (iVar18 < 1) {
          uVar19 = 0;
        }
        if (iVar10 < 1) {
          uVar23 = 0;
        }
        lVar11 = 0;
        local_1a0 = uVar23;
        local_148 = uVar12;
        while (sVar9 = inner_bottom_blob.cstep, sVar8 = inner_bottom_blob.elemsize,
              pvVar21 = inner_bottom_blob.data, uVar12 = local_148, lVar11 < bottom_blob->c) {
          local_208.data =
               (void *)(inner_bottom_blob.cstep * lVar11 * inner_bottom_blob.elemsize +
                       (long)inner_bottom_blob.data);
          local_208.refcount = (int *)0x0;
          local_208.elemsize = inner_bottom_blob.elemsize;
          local_208.allocator = inner_bottom_blob.allocator;
          local_208.dims = 2;
          local_208.w = inner_bottom_blob.w;
          local_208.h = inner_bottom_blob.h;
          local_208.c = 1;
          local_208.cstep = (size_t)(inner_bottom_blob.h * inner_bottom_blob.w);
          Mat::~Mat(&local_208);
          pvVar21 = (void *)(sVar9 * sVar8 * lVar11 + (long)pvVar21);
          iVar10 = 0;
          local_1a8 = lVar11;
          for (uVar15 = 0; pvVar7 = bottom_blob_bordered.data, uVar15 != local_1a0;
              uVar15 = uVar15 + 1) {
            lVar11 = bottom_blob_bordered.cstep * local_1a8 * bottom_blob_bordered.elemsize;
            local_208.data = (void *)((long)bottom_blob_bordered.data + lVar11);
            local_208.refcount = (int *)0x0;
            local_208.elemsize = bottom_blob_bordered.elemsize;
            local_208.allocator = bottom_blob_bordered.allocator;
            local_208.dims = 2;
            local_208.w = bottom_blob_bordered.w;
            local_208.h = bottom_blob_bordered.h;
            local_208.c = 1;
            local_208.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            Mat::~Mat(&local_208);
            puVar25 = (undefined4 *)((long)pvVar7 + lVar11 + (long)iVar10 * 4 + local_150);
            for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
              *(undefined4 *)((long)pvVar21 + uVar12 * 4) = *puVar25;
              puVar25 = puVar25 + uVar5;
            }
            pvVar21 = (void *)((long)pvVar21 + (long)iVar18 * 4);
            iVar10 = iVar10 + (int)local_1b0;
          }
          uVar15 = local_160;
          lVar11 = local_1a8 + 1;
        }
        opt_g.lightmode = local_1b8->lightmode;
        opt_g._1_3_ = *(undefined3 *)&local_1b8->field_0x1;
        opt_g.num_threads = local_1b8->num_threads;
        opt_g.workspace_allocator = local_1b8->workspace_allocator;
        opt_g.blob_allocator = inner_top_blob.allocator;
        (*conv)(&inner_bottom_blob,&inner_top_blob,&(this->super_Convolution).weight_data,
                &(this->super_Convolution).bias_data,&opt_g);
        lVar26 = (long)(int)local_178;
        local_1a0 = (ulong)(int)local_180;
        local_1a8 = (long)local_18c << 2;
        uVar19 = local_158;
        for (lVar11 = 0; lVar11 < (this->super_Convolution).num_output; lVar11 = lVar11 + 1) {
          Mat::channel(&local_208,local_170,(int)lVar11);
          local_210 = (undefined4 *)((long)local_208.data + local_168);
          Mat::~Mat(&local_208);
          lVar28 = 0;
          for (lVar24 = 0; pvVar21 = inner_top_blob.data, lVar24 <= (long)local_1a0;
              lVar24 = lVar24 + 1) {
            lVar22 = inner_top_blob.cstep * lVar11 * inner_top_blob.elemsize;
            local_208.data = (void *)((long)inner_top_blob.data + lVar22);
            local_208.refcount = (int *)0x0;
            local_208.elemsize = inner_top_blob.elemsize;
            local_208.allocator = inner_top_blob.allocator;
            local_208.dims = 2;
            local_208.w = inner_top_blob.w;
            local_208.h = inner_top_blob.h;
            local_208.c = 1;
            local_208.cstep = (size_t)(inner_top_blob.h * inner_top_blob.w);
            Mat::~Mat(&local_208);
            puVar25 = local_210;
            for (lVar16 = 0; lVar16 <= lVar26; lVar16 = lVar16 + 1) {
              *puVar25 = *(undefined4 *)((long)pvVar21 + lVar16 * 4 + lVar22 + lVar28);
              puVar25 = puVar25 + uVar5;
            }
            lVar28 = lVar28 + local_1a8;
            local_210 = local_210 + iVar27 * iVar14;
            uVar19 = local_158;
            uVar12 = local_148;
          }
          uVar15 = local_160;
        }
        local_150 = local_150 + 4;
        local_168 = local_168 + 4;
      }
      local_1d0 = local_1d0 + (long)iVar20 * 4;
      local_1c8 = local_1c8 + (long)iVar13 * 4 + 4;
    }
LAB_0010a6e2:
    Mat::~Mat(&inner_top_blob);
    Mat::~Mat(&inner_bottom_blob);
  }
LAB_0010a6fc:
  Mat::~Mat(&bottom_blob_bordered);
  return local_238;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}